

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ReplicatedAssignmentPatternSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ReplicatedAssignmentPatternSyntax,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>const&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,ExpressionSyntax *args_1,Token *args_2,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *args_3,Token *args_4,Token *args_5)

{
  Token openBrace;
  Token innerOpenBrace;
  Token innerCloseBrace;
  Token closeBrace;
  ReplicatedAssignmentPatternSyntax *this_00;
  
  this_00 = (ReplicatedAssignmentPatternSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ReplicatedAssignmentPatternSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (ReplicatedAssignmentPatternSyntax *)allocateSlow(this,0x88,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  openBrace.kind = args->kind;
  openBrace._2_1_ = args->field_0x2;
  openBrace.numFlags.raw = (args->numFlags).raw;
  openBrace.rawLen = args->rawLen;
  openBrace.info = args->info;
  innerOpenBrace.kind = args_2->kind;
  innerOpenBrace._2_1_ = args_2->field_0x2;
  innerOpenBrace.numFlags.raw = (args_2->numFlags).raw;
  innerOpenBrace.rawLen = args_2->rawLen;
  innerOpenBrace.info = args_2->info;
  closeBrace.kind = args_5->kind;
  closeBrace._2_1_ = args_5->field_0x2;
  closeBrace.numFlags.raw = (args_5->numFlags).raw;
  closeBrace.rawLen = args_5->rawLen;
  closeBrace.info = args_5->info;
  innerCloseBrace.kind = args_4->kind;
  innerCloseBrace._2_1_ = args_4->field_0x2;
  innerCloseBrace.numFlags.raw = (args_4->numFlags).raw;
  innerCloseBrace.rawLen = args_4->rawLen;
  innerCloseBrace.info = args_4->info;
  slang::syntax::ReplicatedAssignmentPatternSyntax::ReplicatedAssignmentPatternSyntax
            (this_00,openBrace,args_1,innerOpenBrace,args_3,innerCloseBrace,closeBrace);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }